

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O3

void __thiscall SceneParser::~SceneParser(SceneParser *this)

{
  pointer ppMVar1;
  pointer ppOVar2;
  CubeMap *pCVar3;
  void *pvVar4;
  pointer pcVar5;
  pointer ppMVar6;
  pointer ppOVar7;
  long lVar8;
  
  if (this->_group != (Group *)0x0) {
    (*(this->_group->super_Object3D)._vptr_Object3D[1])();
  }
  if (this->_camera != (Camera *)0x0) {
    (*this->_camera->_vptr_Camera[1])();
  }
  ppMVar1 = (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar6 = (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppMVar6 != ppMVar1; ppMVar6 = ppMVar6 + 1
      ) {
    operator_delete(*ppMVar6);
  }
  ppOVar2 = (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppOVar7 = (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppOVar7 != ppOVar2; ppOVar7 = ppOVar7 + 1
      ) {
    if (*ppOVar7 != (Object3D *)0x0) {
      (*(*ppOVar7)->_vptr_Object3D[1])();
    }
  }
  pCVar3 = this->_cubemap;
  if (pCVar3 != (CubeMap *)0x0) {
    lVar8 = 0xa8;
    do {
      pvVar4 = *(void **)((long)&pCVar3->_images[0]._width + lVar8);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4);
      }
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x18);
  }
  operator_delete(pCVar3);
  ppOVar7 = (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar7 != (pointer)0x0) {
    operator_delete(ppOVar7);
  }
  ppMVar6 = (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar6 != (pointer)0x0) {
    operator_delete(ppMVar6);
  }
  pcVar5 = (this->_basepath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &(this->_basepath).field_2) {
    operator_delete(pcVar5);
  }
  ppOVar7 = (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar7 != (pointer)0x0) {
    operator_delete(ppOVar7);
    return;
  }
  return;
}

Assistant:

SceneParser::~SceneParser() {
    delete _group;
    delete _camera;
    for (auto *material : _materials) {
        delete material;
    }
    for (auto *object : _objects) {
        delete object;
    }
    delete _cubemap;
}